

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall
MacProj::mac_sync_compute
          (MacProj *this,int level,Array<MultiFab_*,_3> *Ucorr,MultiFab *Sync,int comp,int s_ind,
          MultiFab **sync_edges,int eComp,FluxRegister *adv_flux_reg,
          Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *advectionType,Real dt,
          bool update_fluxreg)

{
  AdvectionForm AVar1;
  RefID RVar2;
  bool bVar3;
  int iVar4;
  AmrLevel **ppAVar5;
  BoxArray *pBVar6;
  long lVar7;
  BCRec *pBVar8;
  AdvectionForm *pAVar9;
  uint *puVar10;
  iterator piVar11;
  reference ppMVar12;
  int in_ESI;
  int in_R8D;
  undefined8 *in_stack_00000008;
  byte in_stack_00000028;
  int d;
  undefined1 in_stack_000005b7;
  Real in_stack_000005b8;
  undefined1 in_stack_000005c7;
  MultiFab *in_stack_000005c8;
  int in_stack_000005d4;
  MultiFab *in_stack_000005d8;
  int in_stack_000005e0;
  int in_stack_000005e4;
  MultiFab *in_stack_000005e8;
  undefined1 in_stack_00000a67;
  Real in_stack_00000a68;
  undefined1 in_stack_00000a77;
  MultiFab *in_stack_00000a78;
  int in_stack_00000a84;
  MultiFab *in_stack_00000a88;
  int in_stack_00000a90;
  int in_stack_00000a94;
  MultiFab *in_stack_00000a98;
  MultiFab *in_stack_00000c40;
  MultiFab *in_stack_00000c48;
  MultiFab *in_stack_00000c50;
  MultiFab *in_stack_00000c58;
  MultiFab *in_stack_00000c60;
  MultiFab *in_stack_00000c68;
  MultiFab *in_stack_00000c70;
  MultiFab *in_stack_00000c78;
  int in_stack_00000c80;
  MultiFab *in_stack_00000c90;
  MultiFab *in_stack_00000c98;
  MultiFab *in_stack_00000ca0;
  int in_stack_00000ca8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000cb0;
  BCRec *in_stack_00000cb8;
  Geometry *in_stack_00000cc0;
  string *in_stack_00000cd0;
  MultiFab *in_stack_00000ea0;
  MultiFab *in_stack_00000ea8;
  MultiFab *in_stack_00000eb0;
  MultiFab *in_stack_00000eb8;
  MultiFab *in_stack_00000ec0;
  MultiFab *in_stack_00000ec8;
  MultiFab *in_stack_00000ed0;
  MultiFab *in_stack_00000ed8;
  int in_stack_00000ee0;
  MultiFab *in_stack_00000ef0;
  MultiFab *in_stack_00000ef8;
  MultiFab *in_stack_00000f00;
  int in_stack_00000f08;
  MultiFab *in_stack_00000f10;
  int in_stack_00000f18;
  MultiFab *in_stack_00000f20;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00000f28;
  BCRec *in_stack_00000f30;
  Geometry *in_stack_00000f38;
  DeviceVector<int> *in_stack_00000f40;
  string *in_stack_00000f50;
  int i_1;
  Vector<int,_std::allocator<int>_> iconserv_h;
  DeviceVector<int> iconserv;
  BCRec *d_bcrec_ptr_1;
  int sync_comp;
  BCRec *d_bcrec_ptr;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcs;
  BoxArray *ba;
  int i;
  int ncomp;
  NavierStokesBase *ns_level;
  Geometry *geom;
  DistributionMapping *dmap;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe958;
  Amr *in_stack_ffffffffffffe960;
  PODVector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_ffffffffffffe968;
  PODVector<int,_std::allocator<int>_> *in_stack_ffffffffffffe970;
  value_type *in_stack_ffffffffffffe980;
  size_type in_stack_ffffffffffffe988;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe990;
  Real in_stack_ffffffffffffe9d0;
  FluxRegister *in_stack_ffffffffffffe9d8;
  FluxRegister *in_stack_ffffffffffffe9e0;
  uint uVar13;
  FluxRegister *in_stack_ffffffffffffe9e8;
  FluxRegister *in_stack_ffffffffffffe9f0;
  undefined1 *local_15c8;
  FluxRegister *local_13d0;
  int local_13c8;
  undefined1 *local_1258;
  int local_124c;
  undefined1 in_stack_fffffffffffff13e;
  undefined1 in_stack_fffffffffffff13f;
  MultiFab *in_stack_fffffffffffff140;
  int in_stack_fffffffffffff14c;
  MultiFab *in_stack_fffffffffffff150;
  int in_stack_fffffffffffff158;
  int in_stack_fffffffffffff15c;
  MultiFab *in_stack_fffffffffffff160;
  undefined1 in_stack_fffffffffffff3ff;
  undefined8 in_stack_fffffffffffff400;
  undefined1 in_stack_fffffffffffff40f;
  undefined5 in_stack_fffffffffffff410;
  undefined1 in_stack_fffffffffffff415;
  undefined1 in_stack_fffffffffffff416;
  undefined1 in_stack_fffffffffffff417;
  undefined4 in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  int in_stack_fffffffffffff428;
  int in_stack_fffffffffffff42c;
  undefined4 in_stack_fffffffffffff430;
  int in_stack_fffffffffffff434;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff438;
  int in_stack_fffffffffffff440;
  int in_stack_fffffffffffff444;
  MultiFab *in_stack_fffffffffffff448;
  MultiFab *in_stack_fffffffffffff450;
  MultiFab *in_stack_fffffffffffff458;
  MultiFab *in_stack_fffffffffffff460;
  MultiFab *in_stack_fffffffffffff468;
  MultiFab *in_stack_fffffffffffff470;
  MultiFab *in_stack_fffffffffffff478;
  MultiFab *in_stack_fffffffffffff480;
  MultiFab *in_stack_fffffffffffff488;
  int in_stack_fffffffffffff490;
  MultiFab *in_stack_fffffffffffff4a0;
  MultiFab *in_stack_fffffffffffff4a8;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff4c0;
  BCRec *in_stack_fffffffffffff4c8;
  Geometry *in_stack_fffffffffffff4d0;
  MultiFab *in_stack_fffffffffffff5d0;
  MultiFab *in_stack_fffffffffffff5d8;
  MultiFab *in_stack_fffffffffffff5e0;
  MultiFab *in_stack_fffffffffffff5e8;
  MultiFab *in_stack_fffffffffffff5f0;
  MultiFab *in_stack_fffffffffffff5f8;
  MultiFab *in_stack_fffffffffffff600;
  MultiFab *in_stack_fffffffffffff608;
  int in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff614;
  RefID in_stack_fffffffffffff618;
  int in_stack_fffffffffffff620;
  int in_stack_fffffffffffff624;
  MultiFab *in_stack_fffffffffffff628;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> in_stack_fffffffffffff630;
  int in_stack_fffffffffffff638;
  undefined4 in_stack_fffffffffffff63c;
  MultiFab *in_stack_fffffffffffff640;
  int in_stack_fffffffffffff648;
  MultiFab *in_stack_fffffffffffff650;
  int in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff65c;
  Geometry *in_stack_fffffffffffff660;
  MultiArray4<double> in_stack_fffffffffffff668;
  MultiArray4<const_double> in_stack_fffffffffffff670;
  pointer in_stack_fffffffffffff678;
  string local_948 [32];
  undefined1 local_928 [856];
  undefined1 local_5d0 [40];
  undefined1 local_5a8 [1328];
  RefID local_78;
  byte local_69;
  int local_5c;
  int local_44;
  char *local_38;
  
  local_69 = in_stack_00000028 & 1;
  local_5c = in_R8D;
  local_44 = in_ESI;
  ppAVar5 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_ffffffffffffe960,(size_type)in_stack_ffffffffffffe958);
  local_78.data = (BARef *)amrex::AmrLevel::DistributionMap(*ppAVar5);
  local_5a8._1320_8_ =
       amrex::AmrMesh::Geom
                 ((AmrMesh *)in_stack_ffffffffffffe960,
                  (int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  local_5a8._1312_8_ =
       amrex::Amr::getLevel
                 (in_stack_ffffffffffffe960,(int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
  local_5a8._1308_4_ = 1;
  local_1258 = local_5a8 + 0x90;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
    local_1258 = local_1258 + 0x180;
  } while (local_1258 != local_5a8 + 0x510);
  for (local_5a8._140_4_ = 0; (int)local_5a8._140_4_ < 3; local_5a8._140_4_ = local_5a8._140_4_ + 1)
  {
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_ffffffffffffe960,(size_type)in_stack_ffffffffffffe958);
    pBVar6 = amrex::AmrLevel::getEdgeBoxArray
                       ((AmrLevel *)in_stack_ffffffffffffe960,
                        (int)((ulong)in_stack_ffffffffffffe958 >> 0x20));
    RVar2.data = local_78.data;
    lVar7 = (long)(int)local_5a8._140_4_;
    local_5a8._128_8_ = pBVar6;
    iVar4 = amrex::FabArrayBase::nGrow((FabArrayBase *)*in_stack_00000008,0);
    local_5a8._96_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5a8._104_8_ = (element_type *)0x0;
    local_5a8._80_8_ = 0;
    local_5a8._88_8_ =
         (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          )0x0;
    local_5a8._112_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x84e7c1);
    in_stack_ffffffffffffe958 =
         (vector<int,_std::allocator<int>_> *)
         amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe960);
    (**(code **)(*(long *)(local_5a8 + lVar7 * 0x180 + 0x90) + 0x10))
              (local_5a8 + lVar7 * 0x180 + 0x90,pBVar6,RVar2.data,1,iVar4,local_5a8 + 0x50);
    amrex::MFInfo::~MFInfo((MFInfo *)0x84e829);
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffe960,(char *)in_stack_ffffffffffffe958);
  if (bVar3) {
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84e89e);
    uVar13 = (uint)((ulong)in_stack_ffffffffffffe9e0 >> 0x20);
    local_5a8._32_8_ = 0.0;
    NavierStokesBase::EBFactory((NavierStokesBase *)0x84e8b7);
    bVar3 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x84e8bf);
    if (bVar3) {
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      in_stack_ffffffffffffe9e0 = (FluxRegister *)((ulong)uVar13 << 0x20);
      in_stack_ffffffffffffe9d0 = (Real)local_5a8._32_8_;
      in_stack_ffffffffffffe9d8 = (FluxRegister *)local_5a8._1320_8_;
      MOL::ComputeSyncAofs
                (in_stack_fffffffffffff160,in_stack_fffffffffffff15c,in_stack_fffffffffffff158,
                 in_stack_fffffffffffff150,in_stack_fffffffffffff14c,in_stack_fffffffffffff140,
                 in_stack_fffffffffffff450,in_stack_fffffffffffff458,in_stack_fffffffffffff460,
                 in_stack_fffffffffffff468,in_stack_fffffffffffff470,in_stack_fffffffffffff478,
                 in_stack_fffffffffffff480,in_stack_fffffffffffff488,in_stack_fffffffffffff490,
                 (bool)in_stack_fffffffffffff13f,in_stack_fffffffffffff4a0,in_stack_fffffffffffff4a8
                 ,(MultiFab *)in_stack_fffffffffffff4b0._M_head_impl,in_stack_fffffffffffff4b8,
                 in_stack_fffffffffffff4c0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4d0,
                 (bool)in_stack_fffffffffffff13e);
    }
    else {
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                 (size_type)in_stack_ffffffffffffe958);
      in_stack_ffffffffffffe9d8 = (FluxRegister *)local_5a8._1320_8_;
      in_stack_ffffffffffffe9d0 = (Real)local_5a8._32_8_;
      std::__cxx11::string::string
                ((string *)local_5a8,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
      in_stack_ffffffffffffe9e8 = (FluxRegister *)local_5a8;
      in_stack_ffffffffffffe9e0 = (FluxRegister *)((ulong)uVar13 << 0x20);
      EBMOL::ComputeSyncAofs
                (in_stack_000005e8,in_stack_000005e4,in_stack_000005e0,in_stack_000005d8,
                 in_stack_000005d4,in_stack_000005c8,in_stack_00000c40,in_stack_00000c48,
                 in_stack_00000c50,in_stack_00000c58,in_stack_00000c60,in_stack_00000c68,
                 in_stack_00000c70,in_stack_00000c78,in_stack_00000c80,(bool)in_stack_000005c7,
                 in_stack_00000c90,in_stack_00000c98,in_stack_00000ca0,in_stack_00000ca8,
                 in_stack_00000cb0,in_stack_00000cb8,in_stack_00000cc0,in_stack_000005b8,
                 (bool)in_stack_000005b7,in_stack_00000cd0);
      std::__cxx11::string::~string((string *)local_5a8);
    }
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84edf6);
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffe960,(char *)in_stack_ffffffffffffe958);
    if (((bVar3) ||
        (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe960,(char *)in_stack_ffffffffffffe958),
        bVar3)) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe960,(char *)in_stack_ffffffffffffe958), bVar3
       )) {
      if (local_5c < 3) {
        local_13c8 = local_5c;
      }
      else {
        local_13c8 = local_5c + -3;
      }
      local_5d0._36_4_ = local_13c8;
      if (local_5c < 3) {
        pBVar8 = NavierStokesBase::get_bcrec_velocity_d_ptr((NavierStokesBase *)0x84eedb);
        local_13d0 = (FluxRegister *)(pBVar8 + (int)local_5d0._36_4_);
      }
      else {
        pBVar8 = NavierStokesBase::get_bcrec_scalars_d_ptr((NavierStokesBase *)0x84ef01);
        local_13d0 = (FluxRegister *)(pBVar8 + (int)local_5d0._36_4_);
      }
      local_5d0._24_8_ = local_13d0;
      amrex::PODVector<int,_std::allocator<int>_>::PODVector
                ((PODVector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe960);
      amrex::Vector<int,_std::allocator<int>_>::Vector
                ((Vector<int,_std::allocator<int>_> *)0x84ef52);
      amrex::PODVector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
      local_928._828_4_ = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
      for (local_928._824_4_ = 0; uVar13 = (uint)((ulong)in_stack_ffffffffffffe9d0 >> 0x20),
          (int)local_928._824_4_ < 1; local_928._824_4_ = local_928._824_4_ + 1) {
        pAVar9 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                           ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                            in_stack_ffffffffffffe960,(size_type)in_stack_ffffffffffffe958);
        AVar1 = *pAVar9;
        puVar10 = (uint *)amrex::Vector<int,_std::allocator<int>_>::operator[]
                                    ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe960,
                                     (size_type)in_stack_ffffffffffffe958);
        *puVar10 = (uint)(AVar1 == Conservative);
      }
      local_928._808_8_ = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffe958);
      local_928._800_8_ = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffe958);
      piVar11 = amrex::PODVector<int,_std::allocator<int>_>::begin
                          ((PODVector<int,_std::allocator<int>_> *)local_5d0);
      amrex::Gpu::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
                (local_928._808_8_,local_928._800_8_,piVar11);
      NavierStokesBase::EBFactory((NavierStokesBase *)0x84f085);
      bVar3 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x84f08d);
      if (bVar3) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe960,(char *)in_stack_ffffffffffffe958);
        if (bVar3) {
          amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          ppMVar12 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                               ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                                (size_type)in_stack_ffffffffffffe958);
          this_00 = (PODVector<int,_std::allocator<int>_> *)*ppMVar12;
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
          in_stack_ffffffffffffe9d8 = (FluxRegister *)&stack0xfffffffffffff238;
          amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
          in_stack_ffffffffffffe9f0 = (FluxRegister *)local_5d0;
          in_stack_ffffffffffffe9d0 = (Real)((ulong)uVar13 << 0x20);
          in_stack_ffffffffffffe9e0 = (FluxRegister *)local_5d0._24_8_;
          in_stack_ffffffffffffe9e8 = (FluxRegister *)local_5a8._1320_8_;
          BDS::ComputeSyncAofs
                    ((MultiFab *)CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430),
                     in_stack_fffffffffffff42c,in_stack_fffffffffffff428,
                     (MultiFab *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                     in_stack_fffffffffffff41c,
                     (MultiFab *)
                     CONCAT17(in_stack_fffffffffffff417,
                              CONCAT16(in_stack_fffffffffffff416,
                                       CONCAT15(in_stack_fffffffffffff415,in_stack_fffffffffffff410)
                                      )),in_stack_fffffffffffff5d0,in_stack_fffffffffffff5d8,
                     in_stack_fffffffffffff5e0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                     in_stack_fffffffffffff5f8,in_stack_fffffffffffff600,in_stack_fffffffffffff608,
                     in_stack_fffffffffffff610,(bool)in_stack_fffffffffffff40f,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                     in_stack_fffffffffffff628,(MultiFab *)in_stack_fffffffffffff630._M_head_impl,
                     in_stack_fffffffffffff638,in_stack_fffffffffffff640,in_stack_fffffffffffff648,
                     in_stack_fffffffffffff650,
                     (BCRec *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                     in_stack_fffffffffffff660,(DeviceVector<int> *)in_stack_fffffffffffff668.hp,
                     (Real)in_stack_fffffffffffff400,(bool)in_stack_fffffffffffff3ff);
          amrex::MultiFab::~MultiFab((MultiFab *)0x84f736);
          amrex::MultiFab::~MultiFab((MultiFab *)0x84f743);
          amrex::MultiFab::~MultiFab((MultiFab *)0x84f750);
        }
        else {
          amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          ppMVar12 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                               ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                                (size_type)in_stack_ffffffffffffe958);
          this_00 = (PODVector<int,_std::allocator<int>_> *)*ppMVar12;
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          std::array<amrex::MultiFab_*,_3UL>::operator[]
                    ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                     (size_type)in_stack_ffffffffffffe958);
          amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
          in_stack_ffffffffffffe9d8 = (FluxRegister *)&stack0xffffffffffffedb8;
          amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
          in_stack_ffffffffffffe9f0 = (FluxRegister *)local_5d0;
          in_stack_ffffffffffffe9d0 = (Real)((ulong)uVar13 << 0x20);
          in_stack_ffffffffffffe9e0 = (FluxRegister *)local_5d0._24_8_;
          in_stack_ffffffffffffe9e8 = (FluxRegister *)local_5a8._1320_8_;
          Godunov::ComputeSyncAofs
                    (in_stack_fffffffffffff448,in_stack_fffffffffffff444,in_stack_fffffffffffff440,
                     (MultiFab *)in_stack_fffffffffffff438._M_pi,in_stack_fffffffffffff434,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
                     in_stack_fffffffffffff5e0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                     in_stack_fffffffffffff5f8,in_stack_fffffffffffff600,in_stack_fffffffffffff608,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
                     (MultiFab *)in_stack_fffffffffffff618.data,in_stack_fffffffffffff620,
                     (bool)in_stack_fffffffffffff427,
                     (MultiFab *)in_stack_fffffffffffff630._M_head_impl,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                     in_stack_fffffffffffff640,in_stack_fffffffffffff648,in_stack_fffffffffffff650,
                     in_stack_fffffffffffff658,(MultiFab *)in_stack_fffffffffffff660,
                     (BCRec *)in_stack_fffffffffffff668.hp,(Geometry *)in_stack_fffffffffffff670.hp,
                     (DeviceVector<int> *)in_stack_fffffffffffff678,
                     (Real)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
                     (bool)in_stack_fffffffffffff417,(bool)in_stack_fffffffffffff416,
                     (bool)in_stack_fffffffffffff415);
          amrex::MultiFab::~MultiFab((MultiFab *)0x84fa3f);
          amrex::MultiFab::~MultiFab((MultiFab *)0x84fa4c);
          amrex::MultiFab::~MultiFab((MultiFab *)0x84fa59);
        }
      }
      else {
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        ppMVar12 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                             ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                              (size_type)in_stack_ffffffffffffe958);
        this_00 = (PODVector<int,_std::allocator<int>_> *)*ppMVar12;
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe960,
                   (size_type)in_stack_ffffffffffffe958);
        amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
        amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe960);
        local_928._0_8_ = (_func_int **)0x0;
        local_928._8_8_ = (_func_int **)0x0;
        local_928._16_8_ = 0;
        amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
                  ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84f237);
        in_stack_ffffffffffffe9f0 = (FluxRegister *)local_5a8._1320_8_;
        in_stack_ffffffffffffe9e8 = (FluxRegister *)local_5d0._24_8_;
        std::__cxx11::string::string
                  (local_948,(string *)&NavierStokesBase::redistribution_type_abi_cxx11_);
        in_stack_ffffffffffffe9e0 = (FluxRegister *)local_928;
        in_stack_ffffffffffffe9d8 = (FluxRegister *)(local_928 + 0x20);
        in_stack_ffffffffffffe9d0 = (Real)((ulong)uVar13 << 0x20);
        EBGodunov::ComputeSyncAofs
                  (in_stack_00000a98,in_stack_00000a94,in_stack_00000a90,in_stack_00000a88,
                   in_stack_00000a84,in_stack_00000a78,in_stack_00000ea0,in_stack_00000ea8,
                   in_stack_00000eb0,in_stack_00000eb8,in_stack_00000ec0,in_stack_00000ec8,
                   in_stack_00000ed0,in_stack_00000ed8,in_stack_00000ee0,(bool)in_stack_00000a77,
                   in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00,in_stack_00000f08,
                   in_stack_00000f10,in_stack_00000f18,in_stack_00000f20,in_stack_00000f28,
                   in_stack_00000f30,in_stack_00000f38,in_stack_00000f40,in_stack_00000a68,
                   (bool)in_stack_00000a67,in_stack_00000f50);
        std::__cxx11::string::~string(local_948);
        amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
                  ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x84f3f2);
        amrex::MultiFab::~MultiFab((MultiFab *)0x84f3ff);
        amrex::MultiFab::~MultiFab((MultiFab *)0x84f40c);
      }
      amrex::Vector<int,_std::allocator<int>_>::~Vector
                ((Vector<int,_std::allocator<int>_> *)0x84faa7);
      amrex::PODVector<int,_std::allocator<int>_>::~PODVector(this_00);
    }
    else {
      local_38 = "MacProj::mac_sync_compute: Unkown adveciton scheme";
      amrex::Abort_host((char *)in_stack_ffffffffffffe970);
    }
  }
  if ((0 < local_44) && ((local_69 & 1) != 0)) {
    for (local_124c = 0; local_124c < 3; local_124c = local_124c + 1) {
      amrex::FluxRegister::FineAdd
                (in_stack_ffffffffffffe9f0,(MultiFab *)in_stack_ffffffffffffe9e8,
                 (int)((ulong)in_stack_ffffffffffffe9e0 >> 0x20),(int)in_stack_ffffffffffffe9e0,
                 (int)((ulong)in_stack_ffffffffffffe9d8 >> 0x20),(int)in_stack_ffffffffffffe9d8,
                 in_stack_ffffffffffffe9d0);
    }
  }
  local_15c8 = local_5a8 + 0x510;
  do {
    local_15c8 = local_15c8 + -0x180;
    amrex::MultiFab::~MultiFab((MultiFab *)0x84fbc4);
  } while (local_15c8 != local_5a8 + 0x90);
  return;
}

Assistant:

void
MacProj::mac_sync_compute (int                    level,
                           Array<MultiFab*,AMREX_SPACEDIM>& Ucorr,
                           MultiFab&              Sync,
                           int                    comp,
                           int                    s_ind,
                           MultiFab* const*       sync_edges,
                           int                    eComp,
                           FluxRegister*          adv_flux_reg,
                           Vector<AdvectionForm>& advectionType,
                           Real                   dt,
                           bool                   update_fluxreg)
{
    const DistributionMapping& dmap     = LevelData[level]->DistributionMap();
    const Geometry& geom         = parent->Geom(level);
    NavierStokesBase& ns_level   = *(NavierStokesBase*) &(parent->getLevel(level));

    const int  ncomp   = 1;         // Number of components to process at once

    MultiFab fluxes[AMREX_SPACEDIM];
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        const BoxArray& ba = LevelData[level]->getEdgeBoxArray(i);
        fluxes[i].define(ba, dmap, 1, sync_edges[0]->nGrow(), MFInfo(),ns_level.Factory());
    }

    //
    // Compute the mac sync correction.
    //
    if ( ns_level.advection_scheme == "MOL" )
    {
        // Bogus arguments -- they will not be used since we don't need to recompute the edge states
        Vector<BCRec>  bcs;
        BCRec  const* d_bcrec_ptr = NULL;

#ifdef AMREX_USE_EB
        if ( !(ns_level.EBFactory().isAllRegular()) )
        {
          EBMOL::ComputeSyncAofs(Sync, s_ind, ncomp,
                                 Sync, s_ind, // this is not used when we pass edge states
                                 D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                 D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                 D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                 D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                 bcs, d_bcrec_ptr, geom, dt,
                                 false,  // not used when we pass edge states
                                 ns_level.redistribution_type);
        }
        else
#endif
        {
          MOL::ComputeSyncAofs(Sync, s_ind, ncomp,
                               Sync, s_ind, // this is not used when we pass edge states
                               D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                               D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                               D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                               D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                               bcs, d_bcrec_ptr, geom,
                               false ); // not used when we pass edge states
        }

    }
    else if ( ns_level.advection_scheme == "Godunov_PLM" ||
              ns_level.advection_scheme == "Godunov_PPM" ||
              ns_level.advection_scheme == "BDS")
    {
        // Possibly unsused  arguments -- used only in EB case since we don't need to recompute the edge states
        const int  sync_comp   = comp < AMREX_SPACEDIM ? comp   : comp-AMREX_SPACEDIM;
        BCRec  const* d_bcrec_ptr = comp < AMREX_SPACEDIM
                                           ? &(ns_level.get_bcrec_velocity_d_ptr())[sync_comp]
                                           : &(ns_level.get_bcrec_scalars_d_ptr())[sync_comp];

        Gpu::DeviceVector<int> iconserv;
        Vector<int> iconserv_h;
        iconserv.resize(ncomp);
        iconserv_h.resize(ncomp, 0);
        for (int i = 0; i < ncomp; ++i) {
            iconserv_h[i] = (advectionType[comp+i] == Conservative) ? 1 : 0;
        }
        Gpu::copy(Gpu::hostToDevice, iconserv_h.begin(), iconserv_h.end(), iconserv.begin());

#ifdef AMREX_USE_EB
        if ( !(ns_level.EBFactory().isAllRegular()) )
        {
          EBGodunov::ComputeSyncAofs(Sync, s_ind, ncomp,
                                     Sync, s_ind,                      // this is not used when known_edgestate = true
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                     MultiFab(), 0, MultiFab(),                        // this is not used when known_edgestate = true
                                     {}, d_bcrec_ptr,
                                     geom, iconserv, dt, true,
                                     ns_level.redistribution_type);
        }
        else
#endif
        if (ns_level.advection_scheme == "BDS")
        {
            BDS::ComputeSyncAofs(Sync, s_ind, ncomp,
                                 MultiFab(), s_ind,                      // this is not used when known_edgestate = true
                                 AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                 AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                 AMREX_D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                 AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                 MultiFab(), 0, MultiFab(),                        // this is not used when known_edgestate = true
                                 d_bcrec_ptr, geom, iconserv, 0.0, false); // this is not used when known_edgestate = true
        }
        else
        {
            Godunov::ComputeSyncAofs(Sync, s_ind, ncomp,
                                     MultiFab(), s_ind,                      // this is not used when known_edgestate = true
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),  // this is not used when we pass edge states
                                     AMREX_D_DECL(*Ucorr[0],*Ucorr[1],*Ucorr[2]),
                                     AMREX_D_DECL(*sync_edges[0],*sync_edges[1],*sync_edges[2]), eComp, true,
                                     AMREX_D_DECL(fluxes[0],fluxes[1],fluxes[2]), 0,
                                     MultiFab(), 0, MultiFab(),                        // this is not used when known_edgestate = true
                                     d_bcrec_ptr, geom, iconserv, 0.0, false, false, false  ); // this is not used when known_edgestate = true
        }
    }
    else
    {
        Abort("MacProj::mac_sync_compute: Unkown adveciton scheme");
    }


    if (level > 0 && update_fluxreg)
    {
        for (int d = 0; d < AMREX_SPACEDIM; ++d)
        {
            adv_flux_reg->FineAdd(fluxes[d],d,0,comp,1,-dt);
        }
    }
}